

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46569::DepsLogTestInvalidHeader::Run(DepsLogTestInvalidHeader *this)

{
  char *__ptr;
  Test *pTVar1;
  bool bVar2;
  bool condition;
  int iVar3;
  LoadStatus LVar4;
  FILE *__s;
  size_t sVar5;
  size_t sVar6;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  State state;
  undefined1 local_c8 [8];
  DepsLog log;
  string err;
  FILE *deps_log;
  size_t i;
  char *kInvalidHeaders [5];
  DepsLogTestInvalidHeader *this_local;
  
  kInvalidHeaders[4] = (char *)this;
  memcpy(&i,&DAT_00261b20,0x28);
  deps_log = (FILE *)0x0;
  while( true ) {
    if ((FILE *)0x4 < deps_log) {
      return;
    }
    __s = fopen("DepsLogTest-tempfile","wb");
    bVar2 = testing::Test::Check
                      (g_current_test,__s != (FILE *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x153,"deps_log != __null");
    pTVar1 = g_current_test;
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
      return;
    }
    sVar5 = strlen(kInvalidHeaders[(long)(deps_log + -1)]);
    __ptr = kInvalidHeaders[(long)(deps_log + -1)];
    sVar6 = strlen(kInvalidHeaders[(long)(deps_log + -1)]);
    sVar6 = fwrite(__ptr,1,sVar6,__s);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar5 == sVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x156,
                       "strlen(kInvalidHeaders[i]) == fwrite(kInvalidHeaders[i], 1, strlen(kInvalidHeaders[i]), deps_log)"
                      );
    pTVar1 = g_current_test;
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
      return;
    }
    iVar3 = fclose(__s);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x157,"0 == fclose(deps_log)");
    if (!bVar2) break;
    std::__cxx11::string::string
              ((string *)
               &log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    DepsLog::DepsLog((DepsLog *)local_c8);
    State::State((State *)local_1e0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"DepsLogTest-tempfile",&local_201);
    LVar4 = DepsLog::Load((DepsLog *)local_c8,&local_200,(State *)local_1e0,
                          (string *)
                          &log.deps_.
                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = testing::Test::Check
                      (pTVar1,LVar4 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x15c,"log.Load(kTestFilename, &state, &err)");
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    pTVar1 = g_current_test;
    bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    else {
      condition = std::operator==("bad deps log signature or version; starting over",
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Test::Check
                (pTVar1,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                 ,0x15d,"\"bad deps log signature or version; starting over\" == err");
    }
    State::~State((State *)local_1e0);
    DepsLog::~DepsLog((DepsLog *)local_c8);
    std::__cxx11::string::~string
              ((string *)
               &log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      return;
    }
    deps_log = deps_log + 1;
  }
  testing::Test::AddAssertionFailure(g_current_test);
  return;
}

Assistant:

TEST_F(DepsLogTest, InvalidHeader) {
  const char *kInvalidHeaders[] = {
    "",                              // Empty file.
    "# ninjad",                      // Truncated first line.
    "# ninjadeps\n",                 // No version int.
    "# ninjadeps\n\001\002",         // Truncated version int.
    "# ninjadeps\n\001\002\003\004"  // Invalid version int.
  };
  for (size_t i = 0; i < sizeof(kInvalidHeaders) / sizeof(kInvalidHeaders[0]);
       ++i) {
    FILE* deps_log = fopen(kTestFilename, "wb");
    ASSERT_TRUE(deps_log != NULL);
    ASSERT_EQ(
        strlen(kInvalidHeaders[i]),
        fwrite(kInvalidHeaders[i], 1, strlen(kInvalidHeaders[i]), deps_log));
    ASSERT_EQ(0 ,fclose(deps_log));

    string err;
    DepsLog log;
    State state;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));
    EXPECT_EQ("bad deps log signature or version; starting over", err);
  }
}